

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

SPIRFunction * __thiscall spirv_cross::Variant::get<spirv_cross::SPIRFunction>(Variant *this)

{
  CompilerError *this_00;
  
  if ((SPIRFunction *)this->holder == (SPIRFunction *)0x0) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"nullptr");
  }
  else {
    if (this->type == TypeFunction) {
      return (SPIRFunction *)this->holder;
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Bad cast");
  }
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const T &get() const
	{
		if (!holder)
			SPIRV_CROSS_THROW("nullptr");
		if (static_cast<Types>(T::type) != type)
			SPIRV_CROSS_THROW("Bad cast");
		return *static_cast<const T *>(holder);
	}